

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4.c
# Opt level: O3

int mbedtls_arc4_crypt(mbedtls_arc4_context *ctx,size_t length,uchar *input,uchar *output)

{
  uchar uVar1;
  uchar uVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar3 = ctx->x;
  uVar4 = (ulong)uVar3;
  uVar7 = ctx->y;
  if (length != 0) {
    sVar5 = 0;
    uVar8 = (ulong)uVar7;
    do {
      uVar3 = (int)uVar4 + 1U & 0xff;
      uVar4 = (ulong)uVar3;
      uVar1 = ctx->m[uVar4];
      bVar6 = (char)uVar8 + uVar1;
      uVar8 = (ulong)bVar6;
      uVar7 = (uint)bVar6;
      uVar2 = ctx->m[uVar8];
      ctx->m[uVar4] = uVar2;
      ctx->m[uVar8] = uVar1;
      output[sVar5] = ctx->m[(byte)(uVar2 + uVar1)] ^ input[sVar5];
      sVar5 = sVar5 + 1;
    } while (length != sVar5);
  }
  ctx->x = uVar3;
  ctx->y = uVar7;
  return 0;
}

Assistant:

int mbedtls_arc4_crypt( mbedtls_arc4_context *ctx, size_t length, const unsigned char *input,
                unsigned char *output )
{
    int x, y, a, b;
    size_t i;
    unsigned char *m;

    x = ctx->x;
    y = ctx->y;
    m = ctx->m;

    for( i = 0; i < length; i++ )
    {
        x = ( x + 1 ) & 0xFF; a = m[x];
        y = ( y + a ) & 0xFF; b = m[y];

        m[x] = (unsigned char) b;
        m[y] = (unsigned char) a;

        output[i] = (unsigned char)
            ( input[i] ^ m[(unsigned char)( a + b )] );
    }

    ctx->x = x;
    ctx->y = y;

    return( 0 );
}